

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O0

Matrix33 * AML::transpose(Matrix33 *__return_storage_ptr__,Matrix33 *rhs)

{
  double local_58;
  double result [9];
  Matrix33 *rhs_local;
  
  local_58 = (rhs->field_0).data[0][0];
  result[0] = (rhs->field_0).data[1][0];
  result[1] = (rhs->field_0).data[2][0];
  result[2] = (rhs->field_0).data[0][1];
  result[3] = (rhs->field_0).data[1][1];
  result[4] = (rhs->field_0).data[2][1];
  result[5] = (rhs->field_0).data[0][2];
  result[6] = (rhs->field_0).data[1][2];
  result[7] = (rhs->field_0).data[2][2];
  result[8] = (double)rhs;
  Matrix33::Matrix33(__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 transpose(const Matrix33& rhs)
    {
        double result[9];
        result[0] = rhs.m11;
        result[1] = rhs.m21;
        result[2] = rhs.m31;
        result[3] = rhs.m12;
        result[4] = rhs.m22;
        result[5] = rhs.m32;
        result[6] = rhs.m13;
        result[7] = rhs.m23;
        result[8] = rhs.m33;
        return Matrix33(result);
    }